

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_to_constructor.cpp
# Opt level: O0

int main(void)

{
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *pdVar1;
  app aVar2;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *pdVar3;
  scope<int,_int,_int> args_1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  v1_3_0 *pvVar4;
  ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&> injector_00;
  dependency_conflict1 args_1_00;
  dependency dVar5;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
  args;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
  args_00;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>
  args_01;
  dependency_conflict dVar6;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>
  args_02;
  app object_3;
  double local_110;
  pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
  local_108;
  undefined1 local_f8 [8];
  i injector_3;
  app object_2;
  int local_c4;
  uint local_c0;
  arg *local_b8;
  undefined1 local_b0 [8];
  i injector_2;
  app object_1;
  int local_7c;
  uint local_78;
  double local_70;
  undefined1 local_68 [8];
  i injector_1;
  app object;
  int local_3c;
  uint local_38;
  double local_30;
  undefined1 local_28 [8];
  i injector;
  
  injector.super_injector_t._20_4_ = 0;
  pdVar1 = boost::ext::di::v1_3_0::core::
           dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
           ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                         *)&boost::ext::di::v1_3_0::bind<example>);
  local_3c = 0x2a;
  object.ex = (example *)0x4055c00000000000;
  dVar5 = boost::ext::di::v1_3_0::core::
          dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
          ::operator()<int,_double,_0>(pdVar1,&local_3c,(double *)&object);
  args.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
  .super_ctor_arg<example,_1,_double> =
       dVar5.
       super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
       .super_ctor_arg<example,_1,_double>.value;
  local_38 = (uint)dVar5.
                   super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
                   .super_ctor_arg<example,_0,_int>.value;
  pvVar4 = (v1_3_0 *)(ulong)local_38;
  args.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
  ._0_8_ = extraout_RDX;
  local_30 = args.
             super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
             .super_ctor_arg<example,_1,_double>.value;
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>,_0,_0>
            ((i *)local_28,pvVar4,args);
  injector_1.super_injector_t._16_8_ =
       boost::ext::di::v1_3_0::operator()((v1_3_0 *)local_28,(i *)pvVar4);
  if (((example *)injector_1.super_injector_t._16_8_)->i != 0x2a) {
    __assert_fail("42 == object.ex.i",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x24,"int main()");
  }
  if ((((example *)injector_1.super_injector_t._16_8_)->d != 87.0) ||
     (NAN(((example *)injector_1.super_injector_t._16_8_)->d))) {
    __assert_fail("87.0 == object.ex.d",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x25,"int main()");
  }
  local_7c = 0x2a;
  object_1.ex = (example *)0x4055c00000000000;
  dVar5 = boost::ext::di::v1_3_0::core::
          dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
          ::operator()<int,_double,_0>
                    ((dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                      *)&boost::ext::di::v1_3_0::bind<example>,&local_7c,(double *)&object_1);
  args_00.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
  .super_ctor_arg<example,_1,_double> =
       dVar5.
       super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
       .super_ctor_arg<example,_1,_double>.value;
  local_78 = (uint)dVar5.
                   super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
                   .super_ctor_arg<example,_0,_int>.value;
  pvVar4 = (v1_3_0 *)(ulong)local_78;
  args_00.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
  ._0_8_ = extraout_RDX_00;
  local_70 = args_00.
             super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
             .super_ctor_arg<example,_1,_double>.value;
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>,_0,_0>
            ((i *)local_68,pvVar4,args_00);
  aVar2 = boost::ext::di::v1_3_0::operator()((v1_3_0 *)local_68,(i *)pvVar4);
  injector_2.super_injector_t._24_8_ = aVar2;
  if ((aVar2.ex)->i != 0x2a) {
    __assert_fail("42 == object.ex.i",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x32,"int main()");
  }
  if (((aVar2.ex)->d != 87.0) || (NAN((aVar2.ex)->d))) {
    __assert_fail("87.0 == object.ex.d",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x33,"int main()");
  }
  pdVar1 = boost::ext::di::v1_3_0::core::
           dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
           ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                         *)&boost::ext::di::v1_3_0::bind<example>);
  local_c4 = 0x2a;
  dVar6 = boost::ext::di::v1_3_0::core::
          dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
          ::operator()<int,_const_boost::ext::di::v1_3_0::placeholders::arg_&,_0>
                    (pdVar1,&local_c4,(arg *)&boost::ext::di::v1_3_0::placeholders::_);
  local_b8 = (arg *)dVar6.
                    super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>
                    .super_ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>.
                    value;
  local_c0 = (uint)dVar6.
                   super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>
                   .super_ctor_arg<example,_0,_int>.value;
  pdVar3 = boost::ext::di::v1_3_0::core::
           dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
           ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                         *)&boost::ext::di::v1_3_0::bind<>);
  object_2.ex = (example *)0x4055c00000000000;
  args_1_00 = boost::ext::di::v1_3_0::core::
              dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
              ::to<double,_0,_0>(pdVar3,(double *)&object_2);
  pvVar4 = (v1_3_0 *)(ulong)local_c0;
  args_02.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>
  .super_ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>.value =
       (arg *)aVar2.ex;
  args_02.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>
  ._0_8_ = local_b8;
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_int>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_const_boost::ext::di::v1_3_0::placeholders::arg_&>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
            ((i *)local_b0,pvVar4,args_02,
             (dependency<boost::ext::di::v1_3_0::scopes::instance,_double,_double,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
              )args_1_00.super_scope<double,_double,_int>.object_);
  aVar2 = boost::ext::di::v1_3_0::operator()((v1_3_0 *)local_b0,(i *)pvVar4);
  injector_3.super_injector_t.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  ._16_8_ = aVar2;
  if ((aVar2.ex)->i != 0x2a) {
    __assert_fail("42 == object.ex.i",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x41,"int main()");
  }
  if (((aVar2.ex)->d != 87.0) || (NAN((aVar2.ex)->d))) {
    __assert_fail("87.0 == object.ex.d",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x42,"int main()");
  }
  pdVar1 = boost::ext::di::v1_3_0::core::
           dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
           ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                         *)&boost::ext::di::v1_3_0::bind<example>);
  args_1.object_ = (int)aVar2.ex;
  local_110 = 87.0;
  local_108 = (pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
               )boost::ext::di::v1_3_0::core::
                dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                ::operator()<const_boost::ext::di::v1_3_0::placeholders::arg_&,_double,_0>
                          (pdVar1,(arg *)&boost::ext::di::v1_3_0::placeholders::_,&local_110);
  pdVar3 = boost::ext::di::v1_3_0::core::
           dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
           ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                         *)&boost::ext::di::v1_3_0::bind<>);
  object_3.ex._0_4_ = 0x2a;
  object_3.ex._4_4_ =
       (int)boost::ext::di::v1_3_0::core::
            dependency<boost::ext::di::v1_3_0::scopes::deduce,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::core::deduced,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
            ::to<int,_0,_0>(pdVar3,(int *)&object_3);
  args_01.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
  .super_ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>.value._4_4_ = 0;
  args_01.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
  .super_ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>.value._0_4_ =
       (scope<int,_int,_int>)(scope<int,_int,_int>)object_3.ex._4_4_;
  args_01.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>
  .super_ctor_arg<example,_1,_double>.value = local_108.super_ctor_arg<example,_1,_double>.value;
  injector_00.value =
       local_108.super_ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>.value
  ;
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_example,_example,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>,_boost::ext::di::v1_3_0::core::ctor_arg<example,_1,_double>_>_>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
            ((i *)local_f8,
             (v1_3_0 *)
             local_108.super_ctor_arg<example,_0,_const_boost::ext::di::v1_3_0::placeholders::arg_&>
             .value,args_01,
             (dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
              )args_1.object_);
  aVar2 = boost::ext::di::v1_3_0::operator()((v1_3_0 *)local_f8,(i *)injector_00.value);
  if ((aVar2.ex)->i != 0x2a) {
    __assert_fail("42 == object.ex.i",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                  ,0x4f,"int main()");
  }
  if (((aVar2.ex)->d == 87.0) && (!NAN((aVar2.ex)->d))) {
    return injector.super_injector_t._20_4_;
  }
  __assert_fail("87.0 == object.ex.d",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bind_to_constructor.cpp"
                ,0x50,"int main()");
}

Assistant:

int main() {
  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>()(42, 87.0) // or di::bind<example>().to<example>(42, 87.0)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }

#if defined(__cpp_variable_templates)
  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>(42, 87.0)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }
#endif

  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>()(42, di::placeholders::_), // inject second argument
      di::bind<>().to(87.0)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }

  {
    // clang-format off
    const auto injector = di::make_injector(
      di::bind<example>()(di::placeholders::_, 87.0), // inject first argument
      di::bind<>().to(42)
    );
    // clang-format on

    auto object = di::create<app>(injector);

    assert(42 == object.ex.i);
    assert(87.0 == object.ex.d);
  }
}